

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  ostream *poVar1;
  byte in_DL;
  string *in_RSI;
  char *pcVar2;
  XmlWriter *in_RDI;
  
  poVar1 = stream(in_RDI);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,"=\"");
  pcVar2 = "false";
  if ((in_DL & 1) != 0) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\"");
  return in_RDI;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, bool attribute ) {
            stream() << " " << name << "=\"" << ( attribute ? "true" : "false" ) << "\"";
            return *this;
        }